

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cBGRA,cBGRA,bReverseSubtract>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  FSpecialColormap *pFVar4;
  EBlend EVar5;
  long lVar6;
  int iVar7;
  BYTE *pBVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  BYTE BVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  
  pFVar4 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar5 = BLEND_NONE;
  }
  else {
    EVar5 = inf->blend;
  }
  switch(EVar5) {
  case BLEND_NONE:
    if (0 < count) {
      pBVar8 = pin + 3;
      lVar6 = 0;
      do {
        BVar1 = *pBVar8;
        if (BVar1 != '\0') {
          iVar7 = (uint)pBVar8[-1] * inf->alpha + (uint)pout[lVar6 * 4 + 2] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar6 * 4 + 2] = (BYTE)((uint)iVar7 >> 0x10);
          iVar7 = (uint)pBVar8[-2] * inf->alpha + (uint)pout[lVar6 * 4 + 1] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar6 * 4 + 1] = (BYTE)((uint)iVar7 >> 0x10);
          iVar7 = (uint)pBVar8[-3] * inf->alpha + (uint)pout[lVar6 * 4] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar6 * 4] = (BYTE)((uint)iVar7 >> 0x10);
          pout[lVar6 * 4 + 3] = BVar1;
        }
        lVar6 = lVar6 + 1;
        pBVar8 = pBVar8 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pBVar8 = pin + 3;
      lVar6 = 0;
      do {
        BVar1 = *pBVar8;
        if (BVar1 != '\0') {
          uVar10 = (uint)pBVar8[-2] * 0x8f + (uint)pBVar8[-1] * 0x4d +
                   ((uint)pBVar8[-3] + (uint)pBVar8[-3] * 8) * 4 >> 0xc;
          iVar7 = (uint)IcePalette[uVar10][0] * inf->alpha + (uint)pout[lVar6 * 4 + 2] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar6 * 4 + 2] = (BYTE)((uint)iVar7 >> 0x10);
          iVar7 = (uint)IcePalette[uVar10][1] * inf->alpha + (uint)pout[lVar6 * 4 + 1] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar6 * 4 + 1] = (BYTE)((uint)iVar7 >> 0x10);
          iVar7 = (uint)IcePalette[uVar10][2] * inf->alpha + (uint)pout[lVar6 * 4] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar6 * 4] = (BYTE)((uint)iVar7 >> 0x10);
          pout[lVar6 * 4 + 3] = BVar1;
        }
        lVar6 = lVar6 + 1;
        pBVar8 = pBVar8 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pBVar8 = pin + 3;
      lVar6 = 0;
      do {
        BVar1 = *pBVar8;
        if (BVar1 != '\0') {
          iVar7 = inf->blendcolor[3];
          iVar11 = ((uint)pBVar8[-1] * iVar7 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar6 * 4 + 2] * -0x10000;
          if (iVar11 >> 0x10 < 1) {
            iVar11 = 0;
          }
          bVar2 = pBVar8[-2];
          iVar14 = inf->blendcolor[1];
          bVar3 = pBVar8[-3];
          iVar16 = inf->blendcolor[2];
          pout[lVar6 * 4 + 2] = (BYTE)((uint)iVar11 >> 0x10);
          iVar11 = ((uint)bVar2 * iVar7 + iVar14 >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar6 * 4 + 1] * -0x10000;
          if (iVar11 >> 0x10 < 1) {
            iVar11 = 0;
          }
          pout[lVar6 * 4 + 1] = (BYTE)((uint)iVar11 >> 0x10);
          iVar7 = ((uint)bVar3 * iVar7 + iVar16 >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar6 * 4] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar6 * 4] = (BYTE)((uint)iVar7 >> 0x10);
          pout[lVar6 * 4 + 3] = BVar1;
        }
        lVar6 = lVar6 + 1;
        pBVar8 = pBVar8 + step;
      } while (count != (int)lVar6);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pBVar8 = pin + 3;
      lVar6 = 0;
      do {
        BVar1 = *pBVar8;
        if (BVar1 != '\0') {
          iVar7 = ((uint)pBVar8[-1] * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar6 * 4 + 2] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          bVar2 = pBVar8[-2];
          iVar11 = inf->blendcolor[1];
          bVar3 = pBVar8[-3];
          iVar14 = inf->blendcolor[2];
          pout[lVar6 * 4 + 2] = (BYTE)((uint)iVar7 >> 0x10);
          iVar7 = ((uint)bVar2 * iVar11 >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar6 * 4 + 1] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar6 * 4 + 1] = (BYTE)((uint)iVar7 >> 0x10);
          iVar7 = ((uint)bVar3 * iVar14 >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar6 * 4] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar6 * 4] = (BYTE)((uint)iVar7 >> 0x10);
          pout[lVar6 * 4 + 3] = BVar1;
        }
        lVar6 = lVar6 + 1;
        pBVar8 = pBVar8 + step;
      } while (count != (int)lVar6);
    }
    break;
  default:
    EVar5 = inf->blend;
    lVar6 = (long)EVar5;
    if (lVar6 < 0x21) {
      if ((BLEND_ICEMAP < EVar5) && (0 < count)) {
        iVar7 = 0x20 - EVar5;
        pBVar8 = pin + 3;
        lVar6 = 0;
        do {
          BVar1 = *pBVar8;
          if (BVar1 != '\0') {
            bVar2 = pBVar8[-3];
            iVar11 = ((uint)pBVar8[-2] * 0x8f + (uint)pBVar8[-1] * 0x4d +
                      ((uint)bVar2 + (uint)bVar2 * 8) * 4 >> 8) * (EVar5 + BLEND_MODULATE);
            iVar14 = (uint)pBVar8[-1] * iVar7 + iVar11;
            iVar16 = (uint)pBVar8[-2] * iVar7 + iVar11;
            iVar11 = (uint)bVar2 * iVar7 + iVar11;
            iVar14 = ((uint)((ulong)((long)iVar14 * 0x84210843) >> 0x24) - (iVar14 >> 0x1f) & 0xff)
                     * inf->alpha + (uint)pout[lVar6 * 4 + 2] * -0x10000;
            BVar12 = (BYTE)((uint)iVar14 >> 0x10);
            if (iVar14 >> 0x10 < 1) {
              BVar12 = '\0';
            }
            pout[lVar6 * 4 + 2] = BVar12;
            iVar14 = ((uint)((ulong)((long)iVar16 * 0x84210843) >> 0x24) - (iVar16 >> 0x1f) & 0xff)
                     * inf->alpha + (uint)pout[lVar6 * 4 + 1] * -0x10000;
            BVar12 = (BYTE)((uint)iVar14 >> 0x10);
            if (iVar14 >> 0x10 < 1) {
              BVar12 = '\0';
            }
            pout[lVar6 * 4 + 1] = BVar12;
            iVar11 = ((uint)((ulong)((long)iVar11 * 0x84210843) >> 0x24) - (iVar11 >> 0x1f) & 0xff)
                     * inf->alpha + (uint)pout[lVar6 * 4] * -0x10000;
            BVar12 = (BYTE)((uint)iVar11 >> 0x10);
            if (iVar11 >> 0x10 < 1) {
              BVar12 = '\0';
            }
            pout[lVar6 * 4] = BVar12;
            pout[lVar6 * 4 + 3] = BVar1;
          }
          lVar6 = lVar6 + 1;
          pBVar8 = pBVar8 + step;
        } while (count != (int)lVar6);
      }
    }
    else if (0 < count) {
      pBVar8 = pin + 3;
      lVar9 = 0;
      do {
        BVar1 = *pBVar8;
        if (BVar1 != '\0') {
          uVar10 = (uint)pBVar8[-2] * 0x8f + (uint)pBVar8[-1] * 0x4d +
                   ((uint)pBVar8[-3] + (uint)pBVar8[-3] * 8) * 4;
          uVar13 = uVar10 >> 8;
          if (0xfe < uVar13) {
            uVar13 = 0xff;
          }
          uVar15 = (ulong)uVar13;
          if (uVar10 < 0x100) {
            uVar15 = 0;
          }
          iVar7 = (uint)*(byte *)((long)pFVar4 + uVar15 * 4 + lVar6 * 0x518 + -0xa6fe) * inf->alpha
                  + (uint)pout[lVar9 * 4 + 2] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          bVar2 = *(byte *)((long)pFVar4 + uVar15 * 4 + lVar6 * 0x518 + -0xa700);
          bVar3 = *(byte *)((long)pFVar4 + uVar15 * 4 + lVar6 * 0x518 + -0xa6ff);
          pout[lVar9 * 4 + 2] = (BYTE)((uint)iVar7 >> 0x10);
          iVar7 = (uint)bVar3 * inf->alpha + (uint)pout[lVar9 * 4 + 1] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar9 * 4 + 1] = (BYTE)((uint)iVar7 >> 0x10);
          iVar7 = (uint)bVar2 * inf->alpha + (uint)pout[lVar9 * 4] * -0x10000;
          if (iVar7 >> 0x10 < 1) {
            iVar7 = 0;
          }
          pout[lVar9 * 4] = (BYTE)((uint)iVar7 >> 0x10);
          pout[lVar9 * 4 + 3] = BVar1;
        }
        lVar9 = lVar9 + 1;
        pBVar8 = pBVar8 + step;
      } while (count != (int)lVar9);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}